

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

ssize_t __thiscall
fmt::v6::internal::
arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>::write
          (arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>
           *this,int __fd,void *__buf,size_t __n)

{
  format_specs *specs;
  buffer<wchar_t> *pbVar1;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  size_t extraout_RAX;
  undefined4 extraout_var;
  void *pvVar7;
  format_error *this_00;
  wchar_t *data;
  undefined4 in_register_00000034;
  wchar_t *__s;
  str_writer<wchar_t> local_38;
  size_t sVar6;
  
  __s = (wchar_t *)CONCAT44(in_register_00000034,__fd);
  if (__s == (wchar_t *)0x0) {
    this_00 = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this_00,"string pointer is null");
    __cxa_throw(this_00,&format_error::typeinfo,format_error::~format_error);
  }
  sVar4 = wcslen(__s);
  specs = this->specs_;
  if (specs == (format_specs *)0x0) {
    pbVar1 = (this->writer_).out_.container;
    sVar2 = pbVar1->size_;
    uVar5 = sVar2 + sVar4;
    sVar6 = sVar4;
    if (pbVar1->capacity_ < uVar5) {
      iVar3 = (**pbVar1->_vptr_buffer)(pbVar1,uVar5);
      sVar6 = CONCAT44(extraout_var,iVar3);
    }
    pbVar1->size_ = uVar5;
    if (sVar4 != 0) {
      pvVar7 = memmove(pbVar1->ptr_ + sVar2,__s,sVar4 << 2);
      return (ssize_t)pvVar7;
    }
  }
  else {
    uVar5 = (ulong)specs->precision;
    local_38.size_ = sVar4;
    if (uVar5 < sVar4) {
      local_38.size_ = uVar5;
    }
    if ((long)uVar5 < 0) {
      local_38.size_ = sVar4;
    }
    local_38.s = __s;
    basic_writer<fmt::v6::buffer_range<wchar_t>>::
    write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::str_writer<wchar_t>>
              ((basic_writer<fmt::v6::buffer_range<wchar_t>> *)this,specs,&local_38);
    sVar6 = extraout_RAX;
  }
  return sVar6;
}

Assistant:

void write(const char_type* value) {
    if (!value) {
      FMT_THROW(format_error("string pointer is null"));
    } else {
      auto length = std::char_traits<char_type>::length(value);
      basic_string_view<char_type> sv(value, length);
      specs_ ? writer_.write(sv, *specs_) : writer_.write(sv);
    }
  }